

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O2

void __thiscall
google::protobuf::strings::LimitByteSource::CopyTo(LimitByteSource *this,ByteSink *sink,size_t n)

{
  LogMessage *other;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (this->limit_ < n) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/bytestream.cc"
               ,0xbf);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (n) <= (limit_): ");
    internal::LogFinisher::operator=(&local_29,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  (*this->source_->_vptr_ByteSource[5])(this->source_,sink,n);
  this->limit_ = this->limit_ - n;
  return;
}

Assistant:

void LimitByteSource::CopyTo(ByteSink *sink, size_t n) {
  GOOGLE_DCHECK_LE(n, limit_);
  source_->CopyTo(sink, n);
  limit_ -= n;
}